

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake256_impl.c
# Opt level: O0

int sprng256_forget(keccak_sponge *sponge)

{
  keccak_sponge *in_RDI;
  keccak_sponge *unaff_retaddr;
  void *in_stack_00000340;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RDI == (keccak_sponge *)0x0) {
    iVar1 = -1;
  }
  else if (in_RDI->position < 0x88) {
    if (in_RDI->flags == 0xbf0420879da9f2d9) {
      keccakf(in_stack_00000340);
      in_RDI->position = 0;
      _sponge_forget(unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      _shake_pad(in_RDI);
      if (in_RDI->position == 0) {
        iVar1 = 0;
      }
      else {
        keccakf(in_stack_00000340);
        in_RDI->position = 0;
        iVar1 = 0;
      }
    }
    else {
      iVar1 = 2;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int sprng256_forget(keccak_sponge* const __restrict sponge) {
  if (sponge == NULL) {
    return SPONGERR_NULL;
  }
  if (sponge->position >= sponge_rate) {
    return SPONGERR_INVARIANT;
  }
  if (sponge->flags != FLAG_SPONGEPRG) {
    return SPONGERR_NOTINIT;
  }

  // Apply the permutation; we then are at position zero.
  keccakf(sponge->a);
  sponge->position = 0;

  // Write sponge_security_strength zero bytes. In this case,
  // this is equivalent to:
  //    memset(sponge->a, 0, 32);
  //    sponge->position = 32;
  _sponge_forget(sponge, sponge_security_strength);

  // Apply padding.
  _shake_pad(sponge);
  if (sponge->position == 0) {
    // The permutation was applied because of the padding rule.
    return 0;
  }

  // The permutation has not yet been applied, so apply it.
  keccakf(sponge->a);
  sponge->position = 0;

  return 0;
}